

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_obmc_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              FULLPEL_MV *best_mv)

{
  int iVar1;
  FULLPEL_MV *in_RCX;
  long in_RSI;
  FULLPEL_MV in_EDI;
  int thissme;
  int bestsme;
  undefined4 in_stack_00000024;
  FULLPEL_MV *in_stack_00000048;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RSI + 0x90) == 0) {
    iVar1 = obmc_full_pixel_diamond
                      ((FULLPEL_MOTION_SEARCH_PARAMS *)best_mv,(FULLPEL_MV)step_param,bestsme,
                       (FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
  }
  else {
    *in_RCX = in_EDI;
    clamp_fullmv(in_RCX,(FullMvLimits *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar1 = obmc_refining_search_sad(in_stack_00000050,in_stack_00000048);
    if (iVar1 < 0x7fffffff) {
      iVar1 = get_obmc_mvpred_var((FULLPEL_MOTION_SEARCH_PARAMS *)
                                  CONCAT44(in_stack_00000024,start_mv),(FULLPEL_MV *)ms_params);
    }
  }
  return iVar1;
}

Assistant:

int av1_obmc_full_pixel_search(const FULLPEL_MV start_mv,
                               const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                               const int step_param, FULLPEL_MV *best_mv) {
  if (!ms_params->fast_obmc_search) {
    const int bestsme =
        obmc_full_pixel_diamond(ms_params, start_mv, step_param, best_mv);
    return bestsme;
  } else {
    *best_mv = start_mv;
    clamp_fullmv(best_mv, &ms_params->mv_limits);
    int thissme = obmc_refining_search_sad(ms_params, best_mv);
    if (thissme < INT_MAX) thissme = get_obmc_mvpred_var(ms_params, best_mv);
    return thissme;
  }
}